

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O2

string * __thiscall pbrt::Curve::ToString_abi_cxx11_(string *__return_storage_ptr__,Curve *this)

{
  float *in_R9;
  
  StringPrintf<pbrt::CurveCommon_const&,float_const&,float_const&>
            (__return_storage_ptr__,(pbrt *)"[ Curve common: %s uMin: %f uMax: %f ]",
             (char *)this->common,(CurveCommon *)&this->uMin,&this->uMax,in_R9);
  return __return_storage_ptr__;
}

Assistant:

std::string Curve::ToString() const {
    return StringPrintf("[ Curve common: %s uMin: %f uMax: %f ]", *common, uMin, uMax);
}